

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

QByteArray * qCleanupFuncinfo(QByteArray *info)

{
  long lVar1;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QByteArrayView bv_03;
  QByteArrayView bv_04;
  bool bVar2;
  char cVar3;
  char cVar4;
  qsizetype qVar5;
  char *pcVar6;
  char *pcVar7;
  __off_t __length;
  __off_t extraout_RDX;
  __off_t __length_00;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char c_1;
  qsizetype end;
  char c;
  qsizetype operatorLength;
  int templatecount;
  int parencount;
  int parencount_1;
  qsizetype pos;
  undefined7 in_stack_fffffffffffffec8;
  char in_stack_fffffffffffffecf;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  char in_stack_fffffffffffffed7;
  undefined1 uVar8;
  QByteArray *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  storage_type *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  char in_stack_ffffffffffffff17;
  QByteArray *in_stack_ffffffffffffff18;
  int local_dc;
  int local_d8;
  int local_d4;
  char *local_d0;
  QByteArray *in_stack_ffffffffffffffa0;
  QByteArrayView in_stack_ffffffffffffffc0;
  QByteArrayView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QByteArray::isEmpty((QByteArray *)0x243855);
  if (bVar2) {
    QByteArray::QByteArray
              ((QByteArray *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
               (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  else {
    qVar5 = QByteArray::size(in_RSI);
    local_d0 = (char *)(qVar5 + -1);
    bVar2 = QByteArray::endsWith
                      ((QByteArray *)
                       CONCAT17(in_stack_fffffffffffffed7,
                                CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                       in_stack_fffffffffffffecf);
    if (((bVar2) &&
        (bVar2 = QByteArray::startsWith
                           ((QByteArray *)
                            CONCAT17(in_stack_fffffffffffffed7,
                                     CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                            in_stack_fffffffffffffecf), !bVar2)) &&
       (bVar2 = QByteArray::startsWith
                          ((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffed7,
                                    CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                           in_stack_fffffffffffffecf), !bVar2)) {
      do {
        local_d0 = local_d0 + -1;
        if (local_d0 == (char *)0x0) goto LAB_0024390f;
        cVar3 = QByteArray::at((QByteArray *)
                               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                               0x2438f4);
      } while (cVar3 != '[');
      QByteArray::truncate(in_RSI,local_d0,__length);
LAB_0024390f:
      bVar2 = QByteArray::endsWith
                        ((QByteArray *)
                         CONCAT17(in_stack_fffffffffffffed7,
                                  CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                         in_stack_fffffffffffffecf);
      if (bVar2) {
        QByteArray::chop((QByteArray *)
                         CONCAT17(in_stack_fffffffffffffed7,
                                  CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                         CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      }
    }
    QByteArrayView::QByteArrayView<10ul>
              ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (char (*) [10])in_stack_fffffffffffffed8);
    QByteArrayView::QByteArrayView<9ul>
              ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (char (*) [9])in_stack_fffffffffffffed8);
    QByteArray::replace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc0);
LAB_00243990:
    pcVar6 = (char *)QByteArray::lastIndexOf
                               (in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                                CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    if (pcVar6 != (char *)0xffffffffffffffff) {
      qVar5 = QByteArray::indexOf(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                                  CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      if ((qVar5 == -1) &&
         (qVar5 = QByteArray::indexOf(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                                      CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8))
         , qVar5 == -1)) {
        local_d4 = 1;
        __length_00 = extraout_RDX;
        while( true ) {
          local_d0 = pcVar6 + -1;
          uVar8 = local_d0 != (char *)0x0 && local_d4 != 0;
          if (local_d0 == (char *)0x0 || local_d4 == 0) break;
          cVar3 = QByteArray::at((QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                 0x243a60);
          pcVar6 = local_d0;
          if (cVar3 == ')') {
            local_d4 = local_d4 + 1;
            __length_00 = extraout_RDX_00;
          }
          else {
            cVar3 = QByteArray::at((QByteArray *)
                                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                   0x243a84);
            __length_00 = extraout_RDX_01;
            if (cVar3 == '(') {
              local_d4 = local_d4 + -1;
            }
          }
        }
        if (local_d4 != 0) {
          QByteArray::QByteArray
                    ((QByteArray *)
                     CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
                     (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
          goto LAB_0024403e;
        }
        QByteArray::truncate(in_RSI,pcVar6,__length_00);
        cVar3 = QByteArray::at((QByteArray *)
                               CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                               0x243aef);
        if (cVar3 == ')') {
          QByteArrayView::QByteArrayView<11ul>
                    ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                     (char (*) [11])in_stack_fffffffffffffed8);
          bv.m_size._7_1_ = in_stack_ffffffffffffff07;
          bv.m_size._0_7_ = in_stack_ffffffffffffff00;
          bv.m_data = in_stack_ffffffffffffff08;
          pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv,CONCAT17(uVar8,in_stack_fffffffffffffee0));
          if (pcVar7 != pcVar6 + -10) {
            QByteArray::indexOf(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7,
                                CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
            QByteArray::remove(in_RSI,(char *)0x0);
            QByteArray::chop((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffed7,
                                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0))
                             ,CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
            goto LAB_00243990;
          }
        }
        local_d8 = 0;
        local_dc = 0;
        if (-1 < (long)local_d0) {
          cVar3 = QByteArray::at((QByteArray *)
                                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                 0x243bac);
          in_stack_fffffffffffffed8 = (QByteArray *)(ulong)((int)cVar3 - 0x29);
          switch(in_stack_fffffffffffffed8) {
          case (QByteArray *)0x0:
            QByteArrayView::QByteArrayView<11ul>
                      ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                       (char (*) [11])in_stack_fffffffffffffed8);
            bv_00.m_size._7_1_ = in_stack_ffffffffffffff07;
            bv_00.m_size._0_7_ = in_stack_ffffffffffffff00;
            bv_00.m_data = in_stack_ffffffffffffff08;
            pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv_00,
                                                 CONCAT17(uVar8,in_stack_fffffffffffffee0));
            if (pcVar7 == pcVar6 + -10) {
              local_d0 = pcVar6 + -3;
            }
            break;
          default:
            break;
          case (QByteArray *)0x13:
            QByteArrayView::QByteArrayView<10ul>
                      ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                       (char (*) [10])in_stack_fffffffffffffed8);
            bv_01.m_size._7_1_ = in_stack_ffffffffffffff07;
            bv_01.m_size._0_7_ = in_stack_ffffffffffffff00;
            bv_01.m_data = in_stack_ffffffffffffff08;
            pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv_01,
                                                 CONCAT17(uVar8,in_stack_fffffffffffffee0));
            if (pcVar7 == pcVar6 + -9) {
              local_d0 = pcVar6 + -2;
            }
            break;
          case (QByteArray *)0x14:
            in_stack_ffffffffffffff18 = (QByteArray *)0xa;
            QByteArrayView::QByteArrayView<11ul>
                      ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                       (char (*) [11])in_stack_fffffffffffffed8);
            bv_03.m_size._7_1_ = in_stack_ffffffffffffff07;
            bv_03.m_size._0_7_ = in_stack_ffffffffffffff00;
            bv_03.m_data = in_stack_ffffffffffffff08;
            pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv_03,
                                                 CONCAT17(uVar8,in_stack_fffffffffffffee0));
            if (pcVar7 == local_d0 + (1 - (long)in_stack_ffffffffffffff18)) {
              local_d0 = pcVar6 + -3;
            }
            else {
              QByteArrayView::QByteArrayView<11ul>
                        ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                         (char (*) [11])in_stack_fffffffffffffed8);
              bv_04.m_size._7_1_ = in_stack_ffffffffffffff07;
              bv_04.m_size._0_7_ = in_stack_ffffffffffffff00;
              bv_04.m_data = in_stack_ffffffffffffff08;
              pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv_04,
                                                   CONCAT17(uVar8,in_stack_fffffffffffffee0));
              if (pcVar7 == local_d0 + (1 - (long)in_stack_ffffffffffffff18)) {
                local_d0 = pcVar6 + -3;
              }
            }
            break;
          case (QByteArray *)0x15:
            QByteArrayView::QByteArrayView<10ul>
                      ((QByteArrayView *)CONCAT17(uVar8,in_stack_fffffffffffffee0),
                       (char (*) [10])in_stack_fffffffffffffed8);
            bv_02.m_size._7_1_ = in_stack_ffffffffffffff07;
            bv_02.m_size._0_7_ = in_stack_ffffffffffffff00;
            bv_02.m_data = in_stack_ffffffffffffff08;
            pcVar7 = (char *)QByteArray::indexOf(in_RSI,bv_02,
                                                 CONCAT17(uVar8,in_stack_fffffffffffffee0));
            if (pcVar7 == pcVar6 + -9) {
              local_d0 = pcVar6 + -2;
            }
          }
        }
        goto LAB_00243d98;
      }
      goto LAB_00243990;
    }
    QByteArray::QByteArray
              ((QByteArray *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
               (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
LAB_0024403e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
LAB_00243d98:
  if ((long)local_d0 < 0) goto LAB_00243e6a;
  if ((local_d8 < 0) || (local_dc < 0)) {
    QByteArray::QByteArray
              ((QByteArray *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
               (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    goto LAB_0024403e;
  }
  in_stack_ffffffffffffff17 =
       QByteArray::at((QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                      0x243dd5);
  if (in_stack_ffffffffffffff17 == ')') {
    local_d8 = local_d8 + 1;
  }
  else if (in_stack_ffffffffffffff17 == '(') {
    local_d8 = local_d8 + -1;
  }
  else if (in_stack_ffffffffffffff17 == '>') {
    local_dc = local_dc + 1;
  }
  else if (in_stack_ffffffffffffff17 == '<') {
    local_dc = local_dc + -1;
  }
  else if (((in_stack_ffffffffffffff17 == ' ') && (local_dc == 0)) && (local_d8 == 0))
  goto LAB_00243e6a;
  local_d0 = local_d0 + -1;
  goto LAB_00243d98;
LAB_00243e6a:
  QByteArray::mid(in_stack_ffffffffffffff18,
                  CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                  (qsizetype)in_stack_ffffffffffffff08);
  QByteArray::operator=
            ((QByteArray *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  QByteArray::~QByteArray((QByteArray *)0x243eab);
  while( true ) {
    cVar3 = QByteArray::at((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),0x243eb9);
    uVar8 = true;
    if (cVar3 != '*') {
      cVar3 = QByteArray::at((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),0x243ed5)
      ;
      uVar8 = cVar3 == '&';
    }
    if ((bool)uVar8 == false) break;
    QByteArray::mid(in_stack_ffffffffffffff18,
                    CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                    (qsizetype)in_stack_ffffffffffffff08);
    QByteArray::operator=
              ((QByteArray *)
               CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
               (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    QByteArray::~QByteArray((QByteArray *)0x243f29);
  }
  cVar3 = '\0';
  while ((pcVar6 = (char *)QByteArray::lastIndexOf
                                     (in_stack_fffffffffffffed8,cVar3,
                                      CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8))
         , pcVar6 != (char *)0xffffffffffffffff &&
         (bVar2 = QByteArray::contains
                            ((QByteArray *)
                             CONCAT17(cVar3,CONCAT16(in_stack_fffffffffffffed6,
                                                     in_stack_fffffffffffffed0)),
                             in_stack_fffffffffffffecf), bVar2))) {
    local_dc = 1;
    while( true ) {
      local_d0 = pcVar6 + -1;
      in_stack_fffffffffffffed6 = local_d0 != (char *)0x0 && local_dc != 0;
      if (local_d0 == (char *)0x0 || local_dc == 0) break;
      cVar4 = QByteArray::at((QByteArray *)
                             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),0x243fbd)
      ;
      pcVar6 = local_d0;
      if (cVar4 == '>') {
        local_dc = local_dc + 1;
      }
      else if (cVar4 == '<') {
        local_dc = local_dc + -1;
      }
    }
    QByteArray::remove(in_RSI,pcVar6);
  }
  QByteArray::QByteArray
            ((QByteArray *)
             CONCAT17(cVar3,CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             (QByteArray *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  goto LAB_0024403e;
}

Assistant:

Q_AUTOTEST_EXPORT QByteArray qCleanupFuncinfo(QByteArray info)
{
    // Strip the function info down to the base function name
    // note that this throws away the template definitions,
    // the parameter types (overloads) and any const/volatile qualifiers.

    if (info.isEmpty())
        return info;

    qsizetype pos;

    // Skip trailing [with XXX] for templates (gcc), but make
    // sure to not affect Objective-C message names.
    pos = info.size() - 1;
    if (info.endsWith(']') && !(info.startsWith('+') || info.startsWith('-'))) {
        while (--pos) {
          if (info.at(pos) == '[') {
              info.truncate(pos);
              break;
          }
        }
        if (info.endsWith(' ')) {
          info.chop(1);
        }
    }

    // operator names with '(', ')', '<', '>' in it
    static const char operator_call[] = "operator()";
    static const char operator_lessThan[] = "operator<";
    static const char operator_greaterThan[] = "operator>";
    static const char operator_lessThanEqual[] = "operator<=";
    static const char operator_greaterThanEqual[] = "operator>=";

    // canonize operator names
    info.replace("operator ", "operator");

    pos = -1;
    // remove argument list
    forever {
        int parencount = 0;
        pos = info.lastIndexOf(')', pos);
        if (pos == -1) {
            // Don't know how to parse this function name
            return info;
        }
        if (info.indexOf('>', pos) != -1
                || info.indexOf(':', pos) != -1) {
            // that wasn't the function argument list.
            --pos;
            continue;
        }

        // find the beginning of the argument list
        --pos;
        ++parencount;
        while (pos && parencount) {
            if (info.at(pos) == ')')
                ++parencount;
            else if (info.at(pos) == '(')
                --parencount;
            --pos;
        }
        if (parencount != 0)
            return info;

        info.truncate(++pos);

        if (info.at(pos - 1) == ')') {
            if (info.indexOf(operator_call) == pos - qsizetype(strlen(operator_call)))
                break;

            // this function returns a pointer to a function
            // and we matched the arguments of the return type's parameter list
            // try again
            info.remove(0, info.indexOf('('));
            info.chop(1);
            continue;
        } else {
            break;
        }
    }